

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O0

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  ulong uVar1;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  FrameworkDescriptor *local_18;
  FrameworkDescriptor *this_local;
  
  local_18 = this;
  this_local = (FrameworkDescriptor *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_48,&this->Name);
    cmAlphaNum::cmAlphaNum(&local_78,',');
    cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_48,&local_78,&this->Suffix);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetLinkName() const
    {
      return this->Suffix.empty() ? this->Name
                                  : cmStrCat(this->Name, ',', this->Suffix);
    }